

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint _c;
  pointer pMVar5;
  size_t _elemsize;
  void *pvVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  pointer pMVar10;
  int _c_00;
  void *pvVar11;
  void *__src;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  void *__dest;
  long lVar17;
  ulong uVar18;
  long local_c0;
  ulong local_a0;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar5->dims;
  _elemsize = pMVar5->elemsize;
  pvVar6 = (this->slices).data;
  if (uVar2 == 1) {
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar8 != 0) {
      iVar7 = pMVar5->w;
      uVar9 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = 0;
      lVar17 = 0;
      iVar12 = 0;
      uVar16 = 0;
      do {
        iVar15 = *(int *)((long)pvVar6 + uVar16 * 4);
        if (iVar15 == -0xe9) {
          iVar15 = (int)((ulong)((long)iVar7 - (long)iVar12) / (uVar9 + lVar17));
        }
        Mat::create((Mat *)((long)&pMVar10->data + lVar8),iVar15,_elemsize,opt->blob_allocator);
        pvVar11 = *(void **)((long)&pMVar10->data + lVar8);
        if (pvVar11 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar8) * *(long *)((long)&pMVar10->cstep + lVar8) ==
            0) {
          return -100;
        }
        memcpy(pvVar11,(void *)(_elemsize * (long)iVar12 + (long)pMVar5->data),
               (long)iVar15 * _elemsize);
        iVar12 = iVar12 + iVar15;
        uVar16 = uVar16 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                -0x71c71c71c71c71c7;
        lVar17 = lVar17 + -1;
        lVar8 = lVar8 + 0x48;
      } while (uVar16 < uVar9);
    }
  }
  else {
    iVar7 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar7 == 0)) {
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar7 = pMVar5->w;
        iVar12 = pMVar5->h;
        uVar9 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar8 = 0;
        lVar17 = 0;
        iVar15 = 0;
        uVar16 = 0;
        do {
          iVar14 = *(int *)((long)pvVar6 + uVar16 * 4);
          if (iVar14 == -0xe9) {
            iVar14 = (int)((ulong)((long)iVar12 - (long)iVar15) / (uVar9 + lVar17));
          }
          Mat::create((Mat *)((long)&pMVar10->data + lVar8),iVar7,iVar14,_elemsize,
                      opt->blob_allocator);
          pvVar11 = *(void **)((long)&pMVar10->data + lVar8);
          if (pvVar11 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar10->c + lVar8) * *(long *)((long)&pMVar10->cstep + lVar8)
              == 0) {
            return -100;
          }
          memcpy(pvVar11,(void *)((long)pMVar5->w * (long)iVar15 * pMVar5->elemsize +
                                 (long)pMVar5->data),(long)(iVar14 * iVar7) * _elemsize);
          iVar15 = iVar15 + iVar14;
          uVar16 = uVar16 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                  -0x71c71c71c71c71c7;
          lVar17 = lVar17 + -1;
          lVar8 = lVar8 + 0x48;
        } while (uVar16 < uVar9);
      }
    }
    else if ((uVar2 == 2) && (iVar7 == 1)) {
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar7 = pMVar5->w;
        uVar2 = pMVar5->h;
        uVar16 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
        iVar12 = 0;
        uVar9 = 0;
        do {
          iVar15 = *(int *)((long)pvVar6 + uVar9 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar7 - (long)iVar12) / (uVar16 - uVar9));
          }
          pMVar1 = pMVar10 + uVar9;
          Mat::create(pMVar1,iVar15,uVar2,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar2) {
            uVar16 = 0;
            do {
              memcpy((void *)((long)pMVar1->w * uVar16 * pMVar1->elemsize + (long)pMVar1->data),
                     (void *)((long)pMVar5->data +
                             (long)iVar12 * _elemsize + (long)pMVar5->w * uVar16 * pMVar5->elemsize)
                     ,(long)iVar15 * _elemsize);
              uVar16 = uVar16 + 1;
            } while (uVar2 != uVar16);
          }
          iVar12 = iVar12 + iVar15;
          uVar9 = uVar9 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar16 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar9 < uVar16);
        return 0;
      }
    }
    else if ((uVar2 - 3 < 2) && (iVar7 == 0)) {
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar7 = pMVar5->w;
        iVar12 = pMVar5->h;
        iVar15 = pMVar5->d;
        iVar14 = pMVar5->c;
        uVar9 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar8 = 0;
        local_c0 = 0;
        iVar13 = 0;
        uVar16 = 0;
        do {
          _c_00 = *(int *)((long)pvVar6 + uVar16 * 4);
          if (_c_00 == -0xe9) {
            _c_00 = (int)((ulong)((long)iVar14 - (long)iVar13) / (uVar9 + local_c0));
          }
          Mat::create((Mat *)((long)&pMVar10->data + lVar8),iVar7,iVar12,iVar15,_c_00,_elemsize,
                      opt->blob_allocator);
          pvVar11 = *(void **)((long)&pMVar10->data + lVar8);
          if (pvVar11 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar10->c + lVar8) * *(long *)((long)&pMVar10->cstep + lVar8)
              == 0) {
            return -100;
          }
          *(uint *)((long)&pMVar10->dims + lVar8) = uVar2;
          memcpy(pvVar11,(void *)(pMVar5->cstep * (long)iVar13 * pMVar5->elemsize +
                                 (long)pMVar5->data),(long)(_c_00 * (int)pMVar5->cstep) * _elemsize)
          ;
          iVar13 = iVar13 + _c_00;
          uVar16 = uVar16 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                  -0x71c71c71c71c71c7;
          local_c0 = local_c0 + -1;
          lVar8 = lVar8 + 0x48;
        } while (uVar16 < uVar9);
        return 0;
      }
    }
    else if (((uVar2 == 3) && (iVar7 == 1)) || ((uVar2 == 4 && (iVar7 == 2)))) {
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar7 = pMVar5->w;
        uVar3 = pMVar5->d;
        iVar12 = pMVar5->h;
        uVar4 = pMVar5->c;
        uVar9 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
        iVar15 = 0;
        uVar16 = 0;
        do {
          iVar14 = *(int *)((long)pvVar6 + uVar16 * 4);
          if (iVar14 == -0xe9) {
            iVar14 = (int)((ulong)((long)iVar12 - (long)iVar15) / (uVar9 - uVar16));
          }
          pMVar1 = pMVar10 + uVar16;
          Mat::create(pMVar1,iVar7,iVar14,uVar3,uVar4,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          pMVar1->dims = uVar2;
          if (0 < (int)uVar4) {
            uVar9 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar18 = 0;
                do {
                  lVar8 = (long)pMVar5->w * pMVar5->elemsize;
                  memcpy((void *)((long)pMVar1->data +
                                 (long)pMVar1->h * pMVar1->elemsize * (long)pMVar1->w * uVar18 +
                                 pMVar1->cstep * uVar9 * pMVar1->elemsize),
                         (void *)((long)pMVar5->data +
                                 lVar8 * iVar15 + (long)pMVar5->h * uVar18 * lVar8 +
                                 pMVar5->cstep * uVar9 * pMVar5->elemsize),
                         (long)(iVar14 * iVar7) * _elemsize);
                  uVar18 = uVar18 + 1;
                } while (uVar3 != uVar18);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar4);
          }
          iVar15 = iVar15 + iVar14;
          uVar16 = uVar16 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                  -0x71c71c71c71c71c7;
        } while (uVar16 < uVar9);
        return 0;
      }
    }
    else {
      if ((uVar2 != 3 || iVar7 != 2) && (iVar7 != 3 || uVar2 != 4)) {
        if (uVar2 != 4) {
          return 0;
        }
        if (iVar7 != 1) {
          return 0;
        }
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar10;
        if (lVar8 == 0) {
          return 0;
        }
        iVar7 = pMVar5->w;
        iVar12 = pMVar5->h;
        iVar15 = pMVar5->d;
        uVar2 = pMVar5->c;
        uVar9 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
        uVar16 = 0;
        iVar14 = 0;
        do {
          iVar13 = *(int *)((long)pvVar6 + uVar16 * 4);
          if (iVar13 == -0xe9) {
            iVar13 = (int)((ulong)((long)iVar15 - (long)iVar14) / (uVar9 - uVar16));
          }
          pMVar1 = pMVar10 + uVar16;
          Mat::create(pMVar1,iVar7,iVar12,iVar13,uVar2,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar2) {
            uVar9 = 0;
            do {
              memcpy((void *)(pMVar1->cstep * uVar9 * pMVar1->elemsize + (long)pMVar1->data),
                     (void *)((long)pMVar5->data +
                             (long)pMVar5->h * pMVar5->elemsize * (long)pMVar5->w * (long)iVar14 +
                             pMVar5->cstep * uVar9 * pMVar5->elemsize),
                     (long)(iVar12 * iVar7 * iVar13) * _elemsize);
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          iVar14 = iVar14 + iVar13;
          uVar16 = uVar16 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                  -0x71c71c71c71c71c7;
        } while (uVar16 < uVar9);
        return 0;
      }
      pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar10;
      if (lVar8 != 0) {
        iVar7 = pMVar5->w;
        uVar3 = pMVar5->h;
        uVar4 = pMVar5->d;
        _c = pMVar5->c;
        uVar16 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
        uVar9 = 0;
        iVar12 = 0;
        do {
          iVar15 = *(int *)((long)pvVar6 + uVar9 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar7 - (long)iVar12) / (uVar16 - uVar9));
          }
          pMVar1 = pMVar10 + uVar9;
          Mat::create(pMVar1,iVar15,uVar3,uVar4,_c,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          pMVar1->dims = uVar2;
          if (0 < (int)_c) {
            local_a0 = 0;
            do {
              if (0 < (int)uVar4) {
                iVar14 = pMVar5->h;
                __dest = (void *)(pMVar1->cstep * local_a0 * pMVar1->elemsize + (long)pMVar1->data);
                pvVar11 = (void *)((long)pMVar5->data +
                                  pMVar5->cstep * pMVar5->elemsize * local_a0 +
                                  (long)iVar12 * _elemsize);
                lVar8 = (long)pMVar5->w * pMVar5->elemsize;
                uVar16 = 0;
                do {
                  __src = pvVar11;
                  uVar18 = (ulong)uVar3;
                  if (0 < (int)uVar3) {
                    do {
                      memcpy(__dest,__src,(long)iVar15 * _elemsize);
                      __dest = (void *)((long)__dest + (long)iVar15 * _elemsize);
                      __src = (void *)((long)__src + lVar8);
                      uVar18 = uVar18 - 1;
                    } while (uVar18 != 0);
                  }
                  uVar16 = uVar16 + 1;
                  pvVar11 = (void *)((long)pvVar11 + iVar14 * lVar8);
                } while (uVar16 != uVar4);
              }
              local_a0 = local_a0 + 1;
            } while (local_a0 != _c);
          }
          iVar12 = iVar12 + iVar15;
          uVar9 = uVar9 + 1;
          pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar16 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar9 < uVar16);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((d - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}